

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O3

OptimizerResult
TasGrid::Optimizer::computeMaximum<(TasGrid::TypeOneDRule)15>
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *current)

{
  long lVar1;
  pointer pdVar2;
  ulong uVar3;
  pointer pdVar4;
  ulong uVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar7;
  undefined8 uVar8;
  double dVar9;
  OptimizerResult OVar10;
  OptimizerResult OVar11;
  vector<double,_std::allocator<double>_> sorted;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  
  ::std::vector<double,_std::allocator<double>_>::vector(&local_60,&current->nodes);
  pdVar2 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar3 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar4,pdVar2);
    pdVar4 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pdVar2 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = getValue<(TasGrid::TypeOneDRule)15>(current,-1.0);
  local_28 = getValue<(TasGrid::TypeOneDRule)15>(current,1.0);
  uVar3 = (ulong)((long)pdVar4 - (long)pdVar2) >> 3;
  local_38 = *(double *)(&DAT_001ca090 + (ulong)(dVar6 < local_28) * 8);
  if (local_28 <= dVar6) {
    local_28 = dVar6;
  }
  OVar10.value = local_28;
  OVar10.node = local_38;
  uStack_30 = 0;
  uVar7 = extraout_XMM0_Qb;
  if (1 < (int)uVar3) {
    uVar5 = 0;
    do {
      dVar6 = OVar10.value;
      local_48 = OVar10.node;
      uVar8 = 0;
      OVar10 = computeLocalMaximum<(TasGrid::TypeOneDRule)15>
                         (current,local_60.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar5],
                          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5 + 1]);
      if (OVar10.value <= dVar6) {
        OVar10.value = dVar6;
        OVar10.node = local_48;
        uVar8 = uVar7;
      }
      uVar7 = uVar8;
      uVar5 = uVar5 + 1;
    } while ((uVar3 + 0xffffffff & 0xffffffff) != uVar5);
  }
  local_48 = OVar10.value;
  dVar6 = OVar10.node;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    uStack_40 = uVar7;
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    OVar10.value = local_48;
    OVar10.node = dVar6;
  }
  dVar9 = OVar10.value;
  dVar6 = dVar9;
  if (dVar9 <= local_28) {
    dVar6 = local_28;
  }
  OVar11.node = (double)(~-(ulong)(local_28 < dVar9) & (ulong)local_38 |
                        (ulong)OVar10.node & -(ulong)(local_28 < dVar9));
  OVar11.value = dVar6;
  return OVar11;
}

Assistant:

OptimizerResult computeMaximum(CurrentNodes<rule> const& current){
    std::vector<double> sorted = current.nodes;
    std::sort(sorted.begin(), sorted.end());
    int num_intervals = (int) sorted.size() - 1;

    auto func = [&](double x)->OptimizerResult{ return {x, getValue<rule>(current, x)}; };

    OptimizerResult max_result = func(-1.0);

    OptimizerResult right_result = func(1.0);

    if (right_result.value > max_result.value)
        max_result = right_result;

    #pragma omp parallel
    {
        OptimizerResult thread_max = max_result, thread_result;

        #pragma omp for schedule(dynamic)
        for(int i=0; i<num_intervals; i++){
            thread_result = computeLocalMaximum(current, sorted[i], sorted[i+1]);
            if ((!std::isnan(thread_result.value)) && (thread_result.value > thread_max.value))
                thread_max = thread_result;
        }

        #pragma omp critical
        {
            if (thread_max.value > max_result.value){
                max_result = thread_max;
            }
        }
    }

    return max_result;
}